

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tripeaks.c
# Opt level: O2

MovePack * tripeaks_movePackGet(Board *board)

{
  uchar uVar1;
  char cVar2;
  MovePack *movePack;
  Spot *pSVar3;
  Spot *pSVar4;
  ulong uVar5;
  Move *pMVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  uint local_70;
  uchar tableauCardRanks [28];
  
  movePack = movePack_create();
  local_70 = 0;
  pSVar3 = board_spotGet(board,STOCK,'\0');
  pSVar4 = board_spotGet(board,FOUNDATION,'\0');
  if (pSVar4->cardsCount != 0) {
    local_70 = (uint)pSVar4->cards[pSVar4->cardsCount - 1]->rank;
  }
  for (lVar8 = 0; lVar8 != 0x1c; lVar8 = lVar8 + 1) {
    pSVar4 = board_spotGet(board,TABLEAU,(uchar)lVar8);
    if (pSVar4->cardsCount == '\x01') {
      uVar1 = (*pSVar4->cards)->rank;
    }
    else {
      uVar1 = '\0';
    }
    tableauCardRanks[lVar8] = uVar1;
  }
  for (uVar5 = 0; uVar5 != 0x12; uVar5 = uVar5 + 1) {
    if (tableauCardRanks[uVar5] != '\0') {
      cVar2 = (char)uVar5;
      if (uVar5 < 3) {
        uVar7 = (uint)(byte)(cVar2 * '\x02' + 3);
      }
      else if (uVar5 < 9) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (double)(int)cVar2 * 0.5;
        auVar9 = vroundsd_avx(auVar9,auVar9,10);
        uVar7 = (uint)(byte)((char)(int)auVar9._0_8_ + cVar2 + 4);
      }
      else {
        uVar7 = (int)uVar5 + 9;
      }
      if ((tableauCardRanks[uVar7 & 0xff] != '\0') ||
         (tableauCardRanks[(ulong)(uVar7 & 0xff) + 1] != '\0')) {
        tableauCardRanks[uVar5] = '\0';
      }
    }
  }
  lVar8 = 0;
  do {
    if (lVar8 == 0x1c) {
      if (pSVar3->cardsCount != '\0') {
        pMVar6 = move_create(MOVE,STOCK,'\0',-1,FOUNDATION,'\0',-1);
        movePack_add(movePack,pMVar6);
      }
      return movePack;
    }
    if (tableauCardRanks[lVar8] != 0) {
      uVar7 = (uint)tableauCardRanks[lVar8];
      if ((local_70 + 1 == uVar7) || (local_70 - 1 == uVar7)) {
LAB_0010531b:
        pMVar6 = move_create(MOVE,TABLEAU,(uchar)lVar8,-1,FOUNDATION,'\0',-1);
        movePack_add(movePack,pMVar6);
      }
      else if (1 < (byte)((gConfig.game)->id - TRIPEAKSSTRICT)) {
        if ((uVar7 == 0xd && local_70 == 1) || (uVar7 == 1 && local_70 == 0xd)) goto LAB_0010531b;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

MovePack * tripeaks_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	Spot * stock = board_spotGet(board, STOCK, 0);
	Spot * foundation = board_spotGet(board, FOUNDATION, 0);
	unsigned char foundationCardRank = foundation->cardsCount>0 ? foundation->cards[foundation->cardsCount-1]->rank : 0;
	unsigned char tableauCardRanks[28];
	Spot * spot;
	unsigned char i, y, tableauCardRank;

	// Get our tableau cards
	for(i=0;i<28;i++)
	{
		spot = board_spotGet(board, TABLEAU, i);
		if(spot->cardsCount==1)
			tableauCardRanks[i] = spot->cards[0]->rank;
		else
			tableauCardRanks[i] = 0;
	}

	// Remove those that are covered up by others
	for(i=0;i<=17;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		if(i<=2)
			y = i+i+3;
		else if(i<=8)
			y = (i+(unsigned char)ceil((double)i/(double)2)+4);
		else
			y = i+9;

		if(tableauCardRanks[y]!=0 || tableauCardRanks[y+1]!=0)
		{
			tableauCardRanks[i] = 0;
			continue;
		}
	}

	// Tableau->Foundation
	for(i=0;i<28;i++)
	{
		tableauCardRank = tableauCardRanks[i];
		if(tableauCardRank==0)
			continue;

		if(tableauCardRank==foundationCardRank+1 || tableauCardRank==foundationCardRank-1 ||
		   (gConfig.game->id!=TRIPEAKSSTRICT && gConfig.game->id!=TRIPEAKSSTRICTHIDDEN && ((tableauCardRank==13 && foundationCardRank==1) || (tableauCardRank==1 && foundationCardRank==13))))
			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));
	}

	// Stock->Foundation
	if(stock->cardsCount>0)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, FOUNDATION, 0, -1));

	return movePack;
}